

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O2

bool __thiscall embree::barrier_sys_regression_test::run(barrier_sys_regression_test *this)

{
  void *pvVar1;
  __int_type _Var2;
  uint uVar3;
  size_t i_1;
  opaque_thread_t **ppoVar4;
  opaque_thread_t **__stat_loc;
  size_t i;
  long lVar5;
  opaque_thread_t **__new_size;
  size_t i_3;
  bool bVar6;
  thread_t local_50;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> threads;
  
  LOCK();
  (this->threadID).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  uVar3 = getNumberOfLogicalThreads();
  __new_size = (opaque_thread_t **)(ulong)uVar3;
  __stat_loc = __new_size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->threadResults,(size_type)__new_size);
  pvVar1 = (this->barrier).opaque;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  *(long *)((long)pvVar1 + 0x18) = (long)__new_size + 1;
  threads.super__Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppoVar4 = __new_size;
  while (bVar6 = ppoVar4 != (opaque_thread_t **)0x0,
        ppoVar4 = (opaque_thread_t **)((long)ppoVar4 + -1), bVar6) {
    local_50 = createThread(thread_alloc,this,0,-1);
    __stat_loc = &local_50;
    std::vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>>::
    emplace_back<embree::opaque_thread_t*>
              ((vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>> *)&threads
               ,&local_50);
  }
  for (lVar5 = 0; lVar5 != 1000; lVar5 = lVar5 + 1) {
    for (ppoVar4 = (opaque_thread_t **)0x0; __new_size != ppoVar4;
        ppoVar4 = (opaque_thread_t **)((long)ppoVar4 + 1)) {
      (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)ppoVar4] = 0;
    }
    BarrierSys::wait(&this->barrier,__stat_loc);
    BarrierSys::wait(&this->barrier,__stat_loc);
    for (ppoVar4 = (opaque_thread_t **)0x0; __new_size != ppoVar4;
        ppoVar4 = (opaque_thread_t **)((long)ppoVar4 + 1)) {
      LOCK();
      (this->numFailed).super___atomic_base<unsigned_long>._M_i =
           (this->numFailed).super___atomic_base<unsigned_long>._M_i +
           (ulong)(ppoVar4 !=
                  (opaque_thread_t **)
                  (this->threadResults).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)ppoVar4]);
      UNLOCK();
    }
  }
  for (ppoVar4 = (opaque_thread_t **)0x0; __new_size != ppoVar4;
      ppoVar4 = (opaque_thread_t **)((long)ppoVar4 + 1)) {
    join(threads.
         super__Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>.
         _M_impl.super__Vector_impl_data._M_start[(long)ppoVar4]);
  }
  _Var2 = (this->numFailed).super___atomic_base<unsigned_long>._M_i;
  std::_Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::
  ~_Vector_base(&threads.
                 super__Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>
               );
  return _Var2 == 0;
}

Assistant:

bool run ()
    {
      threadID.store(0);
      numFailed.store(0);

      size_t numThreads = getNumberOfLogicalThreads();
      threadResults.resize(numThreads);
      barrier.init(numThreads+1);

      /* create threads */
      std::vector<thread_t> threads;
      for (size_t i=0; i<numThreads; i++)
        threads.push_back(createThread((thread_func)thread_alloc,this));

      /* run test */ 
      for (size_t i=0; i<1000; i++)
      {
        for (size_t i=0; i<numThreads; i++) threadResults[i] = 0;
        barrier.wait();
        barrier.wait();
        for (size_t i=0; i<numThreads; i++) numFailed += threadResults[i] != i;
      }

      /* destroy threads */
      for (size_t i=0; i<numThreads; i++)
        join(threads[i]);

      return numFailed == 0;
    }